

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

uint strpool_internal_calculate_hash(char *string,int length,int ignore_case)

{
  char cVar1;
  uint local_34;
  int local_28;
  char c_1;
  int i_1;
  uint uStack_1c;
  char c;
  int i;
  uint hash;
  int ignore_case_local;
  int length_local;
  char *string_local;
  
  uStack_1c = 0x1505;
  if (ignore_case == 0) {
    for (local_28 = 0; local_28 < length; local_28 = local_28 + 1) {
      uStack_1c = uStack_1c * 0x21 ^ (int)string[local_28];
    }
  }
  else {
    for (i_1 = 0; i_1 < length; i_1 = i_1 + 1) {
      cVar1 = string[i_1];
      if ((cVar1 < '{') && ('`' < cVar1)) {
        cVar1 = cVar1 + -0x20;
      }
      uStack_1c = uStack_1c * 0x21 ^ (int)cVar1;
    }
  }
  if (uStack_1c == 0) {
    local_34 = 1;
  }
  else {
    local_34 = uStack_1c;
  }
  return local_34;
}

Assistant:

static STRPOOL_U32 strpool_internal_calculate_hash( char const* string, int length, int ignore_case )
    {
    STRPOOL_U32 hash = 5381U; 

    if( ignore_case) 
        {
        for( int i = 0; i < length; ++i )
            {
            char c = string[ i ];
            c = ( c <= 'z' && c >= 'a' ) ? c - ( 'a' - 'A' ) : c;
            hash = ( ( hash << 5U ) + hash) ^ c;
            }
        }
    else
        {
        for( int i = 0; i < length; ++i )
            {
            char c = string[ i ];
            hash = ( ( hash << 5U ) + hash) ^ c;
            }
        }

    hash = ( hash == 0 ) ? 1 : hash; // We can't allow 0-value hash keys, but dupes are ok
    return hash;
    }